

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O0

Array * __thiscall notch::core::ActivationLayer::output(ActivationLayer *this,Array *inputs)

{
  size_t sVar1;
  bool bVar2;
  size_t sVar3;
  element_type *peVar4;
  Array *inputs_local;
  ActivationLayer *this_local;
  
  SharedBuffers::allocate(&(this->super_ABackpropLayer).shared,this->nSize,this->nSize);
  bVar2 = SharedBuffers::ready(&(this->super_ABackpropLayer).shared);
  if (!bVar2) {
    __assert_fail("shared.ready()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/astanin[P]notch/notch.hpp"
                  ,0x757,"virtual const Array &notch::ActivationLayer::output(const Array &)");
  }
  sVar1 = this->nSize;
  sVar3 = std::valarray<float>::size(inputs);
  if (sVar1 == sVar3) {
    (*(this->super_ABackpropLayer)._vptr_ABackpropLayer[0x10])(this,inputs);
    peVar4 = std::
             __shared_ptr_access<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator*((__shared_ptr_access<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&(this->super_ABackpropLayer).shared.outputBuffer);
    return peVar4;
  }
  __assert_fail("nSize == inputs.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/astanin[P]notch/notch.hpp"
                ,0x758,"virtual const Array &notch::ActivationLayer::output(const Array &)");
}

Assistant:

virtual const Array &output(const Array &inputs) {
        shared.allocate(nSize, nSize); // just in case user didn't init()
        assert (shared.ready());
        assert (nSize == inputs.size());
        outputInplace(inputs);
        return *shared.outputBuffer;
    }